

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_unexpectedOutputParameter_TestShell::
~TEST_MockParameterTest_unexpectedOutputParameter_TestShell
          (TEST_MockParameterTest_unexpectedOutputParameter_TestShell *this)

{
  TEST_MockParameterTest_unexpectedOutputParameter_TestShell *this_local;
  
  ~TEST_MockParameterTest_unexpectedOutputParameter_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockParameterTest, unexpectedOutputParameter)
{
    MockFailureReporterInstaller failureReporterInstaller;

    int param;
    MockExpectedCallsListForTest expectations;
    mock().expectOneCall("foo");
    mock().actualCall("foo").withOutputParameter("parameterName", &param);

    expectations.addFunction("foo");
    MockNamedValue parameter("parameterName");
    parameter.setValue(&param);
    MockUnexpectedOutputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}